

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

int Msat_ClauseCreate(Msat_Solver_t *p,Msat_IntVec_t *vLits,int fLearned,Msat_Clause_t **pClause_out
                     )

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *__src;
  int *piVar4;
  Msat_MmStep_t *p_00;
  Msat_Clause_t *pC_00;
  Msat_ClauseVec_t **ppMVar5;
  int local_8c;
  int iLitMax;
  int iLevelCur;
  int iLevelMax;
  int *pLevel;
  int nSeenId;
  int *pSeen;
  int Sign;
  Msat_Var_t Var;
  int nBytes;
  int j;
  int i;
  int nLits;
  int *pLits;
  Msat_Clause_t *pC;
  Msat_ClauseVec_t **pvWatched;
  int *pAssigns;
  Msat_Clause_t **pClause_out_local;
  int fLearned_local;
  Msat_IntVec_t *vLits_local;
  Msat_Solver_t *p_local;
  
  piVar3 = Msat_SolverReadAssignsArray(p);
  *pClause_out = (Msat_Clause_t *)0x0;
  j = Msat_IntVecReadSize(vLits);
  __src = Msat_IntVecReadArray(vLits);
  if (fLearned == 0) {
    piVar4 = Msat_SolverReadSeenArray(p);
    iVar1 = Msat_SolverReadDecisionLevel(p);
    if (iVar1 != 0) {
      __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                    ,0x4e,
                    "int Msat_ClauseCreate(Msat_Solver_t *, Msat_IntVec_t *, int, Msat_Clause_t **)"
                   );
    }
    Msat_IntVecSort(vLits,0);
    Msat_SolverIncrementSeenId(p);
    iVar1 = Msat_SolverIncrementSeenId(p);
    Var = 0;
    for (nBytes = 0; nBytes < j; nBytes = nBytes + 1) {
      iVar2 = __src[nBytes] >> 1;
      if (piVar4[iVar2] < iVar1 + -1) {
        piVar4[iVar2] = iVar1 - (uint)(((__src[nBytes] & 1U) != 0 ^ 0xffU) & 1);
        if (piVar3[iVar2] == -1) {
          __src[Var] = __src[nBytes];
          Var = Var + 1;
        }
        else if (piVar3[iVar2] == __src[nBytes]) {
          return 1;
        }
      }
      else if ((uint)(piVar4[iVar2] != iVar1) != (__src[nBytes] & 1U)) {
        return 1;
      }
    }
    Msat_IntVecShrink(vLits,Var);
    j = Var;
  }
  if (j == 0) {
    p_local._4_4_ = 0;
  }
  else if (j == 1) {
    p_local._4_4_ = Msat_SolverEnqueue(p,*__src,(Msat_Clause_t *)0x0);
  }
  else {
    iVar2 = j + 2 + fLearned;
    p_00 = Msat_SolverReadMem(p);
    pC_00 = (Msat_Clause_t *)Msat_MmStepEntryFetch(p_00,iVar2 * 4);
    iVar1 = p->nClauses;
    p->nClauses = iVar1 + 1;
    pC_00->Num = iVar1;
    *(uint *)&pC_00->field_0x4 = *(uint *)&pC_00->field_0x4 & 0xfffffffb;
    *(uint *)&pC_00->field_0x4 = *(uint *)&pC_00->field_0x4 & 0xfffffffd;
    *(uint *)&pC_00->field_0x4 = *(uint *)&pC_00->field_0x4 & 0xfffffffe | fLearned & 1U;
    *(uint *)&pC_00->field_0x4 = *(uint *)&pC_00->field_0x4 & 0xfffe0007 | (j & 0x3fffU) << 3;
    *(uint *)&pC_00->field_0x4 = *(uint *)&pC_00->field_0x4 & 0x1ffff | iVar2 * 0x80000;
    memcpy(pC_00 + 1,__src,(long)j << 2);
    if (fLearned != 0) {
      piVar3 = Msat_SolverReadDecisionLevelArray(p);
      local_8c = 1;
      iLitMax = piVar3[__src[1] >> 1];
      for (nBytes = 2; nBytes < j; nBytes = nBytes + 1) {
        iVar1 = piVar3[__src[nBytes] >> 1];
        if (iVar1 == -1) {
          __assert_fail("iLevelCur != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                        ,0xb6,
                        "int Msat_ClauseCreate(Msat_Solver_t *, Msat_IntVec_t *, int, Msat_Clause_t **)"
                       );
        }
        if (iLitMax < iVar1) {
          local_8c = nBytes;
          iLitMax = iVar1;
        }
      }
      *(int *)&pC_00[1].field_0x4 = __src[local_8c];
      (&pC_00[1].Num)[local_8c] = __src[1];
      Msat_ClauseWriteActivity(pC_00,0.0);
      Msat_SolverClaBumpActivity(p,pC_00);
      for (nBytes = 0; nBytes < j; nBytes = nBytes + 1) {
        Msat_SolverVarBumpActivity(p,__src[nBytes]);
      }
    }
    ppMVar5 = Msat_SolverReadWatchedArray(p);
    Msat_ClauseVecPush(ppMVar5[(int)(pC_00[1].Num ^ 1)],pC_00);
    Msat_ClauseVecPush(ppMVar5[(int)(*(uint *)&pC_00[1].field_0x4 ^ 1)],pC_00);
    *pClause_out = pC_00;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int  Msat_ClauseCreate( Msat_Solver_t * p, Msat_IntVec_t * vLits, int  fLearned, Msat_Clause_t ** pClause_out )
{
    int * pAssigns = Msat_SolverReadAssignsArray(p);
    Msat_ClauseVec_t ** pvWatched;
    Msat_Clause_t * pC;
    int * pLits;
    int nLits, i, j;
    int nBytes;
    Msat_Var_t Var;
    int  Sign;

    *pClause_out = NULL;

    nLits = Msat_IntVecReadSize(vLits);
    pLits = Msat_IntVecReadArray(vLits);

    if ( !fLearned ) 
    {
        int * pSeen = Msat_SolverReadSeenArray( p );
        int nSeenId;
        assert( Msat_SolverReadDecisionLevel(p) == 0 );
        // sorting literals makes the code trace-equivalent 
        // with to the original C++ solver
        Msat_IntVecSort( vLits, 0 );
        // increment the counter of seen twice
        nSeenId = Msat_SolverIncrementSeenId( p );
        nSeenId = Msat_SolverIncrementSeenId( p );
        // nSeenId - 1 stands for negative
        // nSeenId     stands for positive
        // Remove false literals

        // there is a bug here!!!!
        // when the same var in opposite polarities is given, it drops one polarity!!!

        for ( i = j = 0; i < nLits; i++ ) {
            // get the corresponding variable
            Var  = MSAT_LIT2VAR(pLits[i]);
            Sign = MSAT_LITSIGN(pLits[i]); // Sign=0 for positive
            // check if we already saw this variable in the this clause
            if ( pSeen[Var] >= nSeenId - 1 )
            {
                if ( (pSeen[Var] != nSeenId) == Sign ) // the same lit
                    continue;
                return 1; // two opposite polarity lits -- don't add the clause
            }
            // mark the variable as seen
            pSeen[Var] = nSeenId - !Sign;

            // analize the value of this literal
            if ( pAssigns[Var] != MSAT_VAR_UNASSIGNED )
            {
                if ( pAssigns[Var] == pLits[i] )
                    return 1;  // the clause is always true -- don't add anything
                // the literal has no impact - skip it
                continue;
            }
            // otherwise, add this literal to the clause
            pLits[j++] = pLits[i];
        }
        Msat_IntVecShrink( vLits, j );
        nLits = j;
/*
        // the problem with this code is that performance is very
        // sensitive to the ordering of adjacency lits
        // the best ordering requires fanins first, next fanouts
        // this ordering is more convenient to make from FRAIG

        // create the adjacency information
        if ( nLits > 2 )
        {
            Msat_Var_t VarI, VarJ;
            Msat_IntVec_t * pAdjI, * pAdjJ;

            for ( i = 0; i < nLits; i++ )
            {
                VarI = MSAT_LIT2VAR(pLits[i]);
                pAdjI = (Msat_IntVec_t *)p->vAdjacents->pArray[VarI];

                for ( j = i+1; j < nLits; j++ )
                {
                    VarJ = MSAT_LIT2VAR(pLits[j]);
                    pAdjJ = (Msat_IntVec_t *)p->vAdjacents->pArray[VarJ];

                    Msat_IntVecPushUniqueOrder( pAdjI, VarJ, 1 );
                    Msat_IntVecPushUniqueOrder( pAdjJ, VarI, 1 );
                }
            }
        }
*/
    }
    // 'vLits' is now the (possibly) reduced vector of literals.
    if ( nLits == 0 )
        return 0;
    if ( nLits == 1 )
        return Msat_SolverEnqueue( p, pLits[0], NULL );

    // Allocate clause:
//    nBytes = sizeof(unsigned)*(nLits + 1 + (int)fLearned);
    nBytes = sizeof(unsigned)*(nLits + 2 + (int)fLearned);
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    pC = (Msat_Clause_t *)ABC_ALLOC( char, nBytes );
#else
    pC = (Msat_Clause_t *)Msat_MmStepEntryFetch( Msat_SolverReadMem(p), nBytes );
#endif
    pC->Num        = p->nClauses++;
    pC->fTypeA     = 0;
    pC->fMark      = 0;
    pC->fLearned   = fLearned;
    pC->nSize      = nLits;
    pC->nSizeAlloc = nBytes;
    memcpy( pC->pData, pLits, sizeof(int)*nLits );

    // For learnt clauses only:
    if ( fLearned )
    {
        int * pLevel = Msat_SolverReadDecisionLevelArray( p );
        int iLevelMax, iLevelCur, iLitMax;

        // Put the second watch on the literal with highest decision level:
        iLitMax = 1;
        iLevelMax = pLevel[ MSAT_LIT2VAR(pLits[1]) ];
        for ( i = 2; i < nLits; i++ )
        {
            iLevelCur = pLevel[ MSAT_LIT2VAR(pLits[i]) ];
            assert( iLevelCur != -1 );
            if ( iLevelMax < iLevelCur )
            // this is very strange - shouldn't it be???
            // if ( iLevelMax > iLevelCur )
                iLevelMax = iLevelCur, iLitMax = i;
        }
        pC->pData[1]       = pLits[iLitMax];
        pC->pData[iLitMax] = pLits[1];

        // Bumping:
        // (newly learnt clauses should be considered active)
        Msat_ClauseWriteActivity( pC, 0.0 );
        Msat_SolverClaBumpActivity( p, pC ); 
//        if ( nLits < 20 )
        for ( i = 0; i < nLits; i++ )
        {
            Msat_SolverVarBumpActivity( p, pLits[i] );
//            Msat_SolverVarBumpActivity( p, pLits[i] );
//            p->pFreq[ MSAT_LIT2VAR(pLits[i]) ]++;
        }
    }

    // Store clause:
    pvWatched = Msat_SolverReadWatchedArray( p );
    Msat_ClauseVecPush( pvWatched[ MSAT_LITNOT(pC->pData[0]) ], pC );
    Msat_ClauseVecPush( pvWatched[ MSAT_LITNOT(pC->pData[1]) ], pC );
    *pClause_out = pC;
    return 1;
}